

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O3

void duckdb_brotli::InverseMoveToFrontTransform
               (uint8_t *v,uint64_t v_len,BrotliDecoderStateInternal *state)

{
  uint8_t *__src;
  uint8_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  long lVar6;
  uint64_t uVar7;
  ulong uVar8;
  int iVar10;
  undefined1 auVar9 [16];
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  
  uVar7 = state->mtf_upper_bound;
  state->mtf[1] = 0x3020100;
  auVar4 = _DAT_01d9abd0;
  auVar3 = _DAT_01d99b10;
  auVar2 = _DAT_01d99b00;
  uVar5 = uVar7 + 1;
  uVar8 = 2;
  if (2 < uVar5) {
    uVar8 = uVar5;
  }
  lVar6 = uVar8 - 2;
  auVar9._8_4_ = (int)lVar6;
  auVar9._0_8_ = lVar6;
  auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
  iVar11 = 0x3020100;
  iVar12 = 0x7060504;
  iVar13 = 0xb0a0908;
  iVar14 = 0xf0e0d0c;
  uVar5 = 0;
  auVar9 = auVar9 ^ _DAT_01d99b10;
  do {
    auVar16._8_4_ = (int)uVar5;
    auVar16._0_8_ = uVar5;
    auVar16._12_4_ = (int)(uVar5 >> 0x20);
    auVar15 = (auVar16 | auVar2) ^ auVar3;
    iVar10 = auVar9._4_4_;
    if ((bool)(~(auVar15._4_4_ == iVar10 && auVar9._0_4_ < auVar15._0_4_ || iVar10 < auVar15._4_4_)
              & 1)) {
      state->mtf[uVar5 + 2] = iVar11 + 0x4040404;
    }
    if ((auVar15._12_4_ != auVar9._12_4_ || auVar15._8_4_ <= auVar9._8_4_) &&
        auVar15._12_4_ <= auVar9._12_4_) {
      state->mtf[uVar5 + 3] = iVar12 + 0x4040404;
    }
    auVar15 = (auVar16 | auVar4) ^ auVar3;
    iVar17 = auVar15._4_4_;
    if (iVar17 <= iVar10 && (iVar17 != iVar10 || auVar15._0_4_ <= auVar9._0_4_)) {
      state->mtf[uVar5 + 4] = iVar13 + 0x4040404;
      state->mtf[uVar5 + 5] = iVar14 + 0x4040404;
    }
    uVar5 = uVar5 + 4;
    iVar11 = iVar11 + 0x10101010;
    iVar12 = iVar12 + 0x10101010;
    iVar13 = iVar13 + 0x10101010;
    iVar14 = iVar14 + 0x10101010;
  } while ((uVar8 + 2 & 0xfffffffffffffffc) != uVar5);
  if (v_len == 0) {
    uVar7 = 0;
  }
  else {
    __src = (uint8_t *)((long)state->mtf + 3);
    uVar7 = 0;
    uVar8 = 0;
    do {
      uVar5 = (ulong)v[uVar7];
      uVar1 = *(uint8_t *)((long)(state->mtf + 1) + uVar5);
      v[uVar7] = uVar1;
      *__src = uVar1;
      memmove(state->mtf + 1,__src,uVar5 + 1);
      uVar8 = uVar8 | uVar5;
      uVar7 = uVar7 + 1;
    } while (v_len != uVar7);
    uVar7 = uVar8 >> 2;
  }
  state->mtf_upper_bound = uVar7;
  return;
}

Assistant:

static BROTLI_NOINLINE void InverseMoveToFrontTransform(uint8_t *v, brotli_reg_t v_len, BrotliDecoderState *state) {
	/* Reinitialize elements that could have been changed. */
	brotli_reg_t i = 1;
	brotli_reg_t upper_bound = state->mtf_upper_bound;
	uint32_t *mtf = &state->mtf[1]; /* Make mtf[-1] addressable. */
	uint8_t *mtf_u8 = (uint8_t *)mtf;
	/* Load endian-aware constant. */
	const uint8_t b0123[4] = {0, 1, 2, 3};
	uint32_t pattern;
	memcpy(&pattern, &b0123, 4);

	/* Initialize list using 4 consequent values pattern. */
	mtf[0] = pattern;
	do {
		pattern += 0x04040404; /* Advance all 4 values by 4. */
		mtf[i] = pattern;
		i++;
	} while (i <= upper_bound);

	/* Transform the input. */
	upper_bound = 0;
	for (i = 0; i < v_len; ++i) {
		int index = v[i];
		uint8_t value = mtf_u8[index];
		upper_bound |= v[i];
		v[i] = value;
		mtf_u8[-1] = value;
		do {
			index--;
			mtf_u8[index + 1] = mtf_u8[index];
		} while (index >= 0);
	}
	/* Remember amount of elements to be reinitialized. */
	state->mtf_upper_bound = upper_bound >> 2;
}